

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlq.cpp
# Opt level: O0

bool __thiscall
pg::TLQSolver::attractTangle(TLQSolver *this,int t,int pl,bitset *R,bitset *Z,bitset *G)

{
  int iVar1;
  bool bVar2;
  uint *puVar3;
  reference ppiVar4;
  reference pvVar5;
  ostream *poVar6;
  uint *puVar7;
  _label_vertex _Var8;
  _label_vertex local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  int s;
  int v_2;
  int *ptr_2;
  undefined1 local_a8 [28];
  int v_1;
  int *ptr_1;
  undefined1 local_78 [16];
  undefined1 local_68 [28];
  int v;
  int *ptr;
  bool can_attract_new;
  bitset *pbStack_40;
  int tangle_pr;
  bitset *G_local;
  bitset *Z_local;
  bitset *R_local;
  int pl_local;
  int t_local;
  TLQSolver *this_local;
  uintqueue *local_10;
  
  pbStack_40 = G;
  G_local = Z;
  Z_local = R;
  R_local._0_4_ = pl;
  R_local._4_4_ = t;
  _pl_local = this;
  puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&this->tpr,(long)t);
  ptr._4_4_ = *puVar3;
  if ((ptr._4_4_ != 0xffffffff) && ((uint)R_local == (ptr._4_4_ & 1))) {
    ptr._3_1_ = 0;
    ppiVar4 = std::vector<int_*,_std::allocator<int_*>_>::operator[](&this->tv,(long)R_local._4_4_);
    unique0x00012000 = *ppiVar4;
    while( true ) {
      local_68._20_4_ = *stack0xffffffffffffffb0;
      if (local_68._20_4_ == -1) break;
      register0x00000000 = stack0xffffffffffffffb0 + 2;
      bitset::operator[]((bitset *)local_68,(size_t)&this->G);
      bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_68);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->tpr,(long)R_local._4_4_);
        *pvVar5 = -1;
        return false;
      }
      bitset::operator[]((bitset *)local_78,(size_t)G_local);
      bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_78);
      if (!bVar2) {
        bitset::operator[]((bitset *)&ptr_1,(size_t)Z_local);
        bVar2 = bitset::reference::operator_cast_to_bool((reference *)&ptr_1);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          return false;
        }
        ptr._3_1_ = 1;
      }
    }
    if ((ptr._3_1_ & 1) != 0) {
      unique0x100003db = stack0xffffffffffffffb0 + 1;
      ppiVar4 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                          (&this->tout,(long)R_local._4_4_);
      unique0x00012000 = *ppiVar4;
      do {
        do {
          local_a8._20_4_ = *stack0xffffffffffffff70;
          if (local_a8._20_4_ == -1) {
            unique0x100003cb = stack0xffffffffffffff70 + 1;
            ppiVar4 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                                (&this->tv,(long)R_local._4_4_);
            _s = (uint *)*ppiVar4;
            while( true ) {
              puVar7 = _s + 1;
              local_d8._20_4_ = *_s;
              if (local_d8._20_4_ == 0xffffffff) break;
              _s = _s + 2;
              local_d8._16_4_ = *puVar7;
              bitset::operator[]((bitset *)local_d8,(size_t)G_local);
              bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_d8);
              if (!bVar2) {
                bitset::operator[]((bitset *)local_e8,(size_t)G_local);
                bitset::reference::operator=((reference *)local_e8,true);
                this->str[(int)local_d8._20_4_] = local_d8._16_4_;
                local_10 = &this->Q;
                this_local._4_4_ = local_d8._20_4_;
                iVar1 = (this->Q).pointer;
                (this->Q).pointer = iVar1 + 1;
                local_10->queue[iVar1] = local_d8._20_4_;
                if (2 < (this->super_Solver).trace) {
                  poVar6 = std::operator<<((this->super_Solver).logger,
                                           "\x1b[1;37mattracted \x1b[36m");
                  _Var8 = Solver::label_vertex(&this->super_Solver,local_d8._20_4_);
                  local_f8.g = _Var8.g;
                  local_f8.v = _Var8.v;
                  poVar6 = operator<<(poVar6,&local_f8);
                  poVar6 = std::operator<<(poVar6,"\x1b[m by \x1b[1;36m");
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)R_local);
                  std::operator<<(poVar6,"\x1b[m");
                  poVar6 = std::operator<<((this->super_Solver).logger," (via tangle ");
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,R_local._4_4_);
                  poVar6 = std::operator<<(poVar6,")");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                }
              }
            }
            return true;
          }
          unique0x100003d3 = stack0xffffffffffffff70 + 1;
          bitset::operator[]((bitset *)local_a8,(size_t)G_local);
          bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_a8);
        } while (bVar2);
        bitset::operator[]((bitset *)&ptr_2,(size_t)pbStack_40);
        bVar2 = bitset::reference::operator_cast_to_bool((reference *)&ptr_2);
      } while (!bVar2);
    }
  }
  return false;
}

Assistant:

bool
TLQSolver::attractTangle(int t, const int pl, bitset &R, bitset &Z, bitset &G)
{
    /**
     * Check if tangle is won by player <pl> and not deleted
     */
    {
        const int tangle_pr = tpr[t];
        if (tangle_pr == -1) return false; // deleted tangle
        if (pl != (tangle_pr&1)) return false; // not of desired parity
    }

    /**
     * Check if tangle is contained in Z+R and if any vertices are not already in Z
     * We require at least one vertex in Z\R. Otherwise, don´t attract.
     */
    {
        bool can_attract_new = false;
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            ptr++; // skip strategy
            if (!this->G[v]) {
                // on-the-fly detect out-of-game tangles
                tpr[t] = -1; // delete the tangle
                return false; // is now a deleted tangle
            } else if (Z[v]) {
                continue; // already attracted
            } else if (!R[v]) {
                return false; // not contained in Z+R
            } else {
                can_attract_new = true; // has vertices not yet attracted
            }
        }
        if (!can_attract_new) return false; // either no vertices in R\Z or strategy leaves R+Z
    }

    /**
     * Check if the tangle can escape to G\Z.
     */
    {
        int *ptr = tout[t];
        int v;
        while ((v=*ptr++) != -1) {
            if (Z[v]) continue;
            if (G[v]) return false; // opponent escapes
        }
    }

    /**
     * Attract!
     */
    {
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            const int s = *ptr++;
            if (Z[v]) continue; // already in <Z>
            Z[v] = true;
            str[v] = s;
            Q.push(v);

#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(v) << "\033[m by \033[1;36m" << pl << "\033[m";
                logger << " (via tangle " << t << ")" << std::endl;
            }
#endif
        }
    }

    return true;
}